

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte bVar1;
  stbi_uc sVar2;
  int a_00;
  stbi__context *psVar3;
  int iVar4;
  int iVar5;
  uint a_01;
  int iVar6;
  stbi_uc *psVar7;
  void *__ptr;
  uint uVar8;
  byte *__src;
  bool bVar9;
  stbi_uc *psStack_c0;
  stbi__uint32 nsmp_1;
  stbi__uint16 *dest16;
  stbi__uint32 nsmp;
  stbi_uc inb;
  stbi_uc *out;
  stbi_uc *in;
  uint local_98;
  stbi_uc scale;
  int filter;
  int nk;
  stbi_uc *dest;
  stbi_uc *prior;
  stbi_uc *cur;
  int width;
  int filter_bytes;
  int output_bytes;
  int img_n;
  int k;
  int all_ok;
  stbi_uc *filter_buf;
  stbi__uint32 img_width_bytes;
  stbi__uint32 img_len;
  stbi__uint32 stride;
  stbi__uint32 j;
  stbi__uint32 i;
  stbi__context *s;
  int bytes;
  stbi__uint32 y_local;
  stbi__uint32 x_local;
  int out_n_local;
  stbi__uint32 raw_len_local;
  stbi_uc *raw_local;
  stbi__png *a_local;
  
  iVar4 = 1;
  if (depth == 0x10) {
    iVar4 = 2;
  }
  psVar3 = a->s;
  img_n = 1;
  a_00 = psVar3->img_n;
  cur._4_4_ = a_00 * iVar4;
  bVar9 = true;
  if (out_n != psVar3->img_n) {
    bVar9 = out_n == psVar3->img_n + 1;
  }
  if (!bVar9) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                  ,0x1266,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar7 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n * iVar4,0);
  a->out = psVar7;
  if (a->out == (stbi_uc *)0x0) {
    a_local._4_4_ = stbi__err("outofmem");
  }
  else {
    iVar5 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar5 == 0) {
      a_local._4_4_ = stbi__err("too large");
    }
    else {
      a_01 = a_00 * x * depth + 7 >> 3;
      iVar5 = stbi__mad2sizes_valid(a_01,y,a_01);
      if (iVar5 == 0) {
        a_local._4_4_ = stbi__err("too large");
      }
      else if (raw_len < (a_01 + 1) * y) {
        a_local._4_4_ = stbi__err("not enough pixels");
      }
      else {
        __ptr = stbi__malloc_mad2(a_01,2,0);
        if (__ptr == (void *)0x0) {
          a_local._4_4_ = stbi__err("outofmem");
        }
        else {
          cur._0_4_ = x;
          if (depth < 8) {
            cur._4_4_ = 1;
            cur._0_4_ = a_01;
          }
          _out_n_local = raw;
          for (img_len = 0; img_len < y; img_len = img_len + 1) {
            out = (stbi_uc *)((long)__ptr + (ulong)((img_len & 1) * a_01));
            uVar8 = ((img_len ^ 0xffffffff) & 1) * a_01;
            psStack_c0 = a->out + x * out_n * iVar4 * img_len;
            iVar5 = (stbi__uint32)cur * cur._4_4_;
            __src = _out_n_local + 1;
            local_98 = (uint)*_out_n_local;
            if (4 < local_98) {
              img_n = stbi__err("invalid filter");
              break;
            }
            if (img_len == 0) {
              local_98 = (uint)first_row_filter[(int)local_98];
            }
            switch(local_98) {
            case 0:
              memcpy(out,__src,(long)iVar5);
              break;
            case 1:
              memcpy(out,__src,(long)cur._4_4_);
              for (output_bytes = cur._4_4_; output_bytes < iVar5; output_bytes = output_bytes + 1)
              {
                out[output_bytes] = __src[output_bytes] + out[output_bytes - cur._4_4_];
              }
              break;
            case 2:
              for (output_bytes = 0; output_bytes < iVar5; output_bytes = output_bytes + 1) {
                out[output_bytes] =
                     __src[output_bytes] +
                     *(char *)((long)__ptr + (long)output_bytes + (ulong)uVar8);
              }
              break;
            case 3:
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                out[output_bytes] =
                     __src[output_bytes] +
                     (char)((int)(uint)*(byte *)((long)__ptr + (long)output_bytes + (ulong)uVar8) >>
                           1);
              }
              for (output_bytes = cur._4_4_; output_bytes < iVar5; output_bytes = output_bytes + 1)
              {
                out[output_bytes] =
                     __src[output_bytes] +
                     (char)((int)((uint)*(byte *)((long)__ptr + (long)output_bytes + (ulong)uVar8) +
                                 (uint)out[output_bytes - cur._4_4_]) >> 1);
              }
              break;
            case 4:
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                out[output_bytes] =
                     __src[output_bytes] +
                     *(char *)((long)__ptr + (long)output_bytes + (ulong)uVar8);
              }
              for (output_bytes = cur._4_4_; output_bytes < iVar5; output_bytes = output_bytes + 1)
              {
                bVar1 = __src[output_bytes];
                iVar6 = stbi__paeth((uint)out[output_bytes - cur._4_4_],
                                    (uint)*(byte *)((long)__ptr + (long)output_bytes + (ulong)uVar8)
                                    ,(uint)*(byte *)((long)__ptr +
                                                    (long)(output_bytes - cur._4_4_) + (ulong)uVar8)
                                   );
                out[output_bytes] = bVar1 + (char)iVar6;
              }
              break;
            case 5:
              memcpy(out,__src,(long)cur._4_4_);
              for (output_bytes = cur._4_4_; output_bytes < iVar5; output_bytes = output_bytes + 1)
              {
                out[output_bytes] =
                     __src[output_bytes] + (char)((int)(uint)out[output_bytes - cur._4_4_] >> 1);
              }
            }
            _out_n_local = __src + iVar5;
            if (depth < 8) {
              if (color == 0) {
                sVar2 = ""[depth];
              }
              else {
                sVar2 = '\x01';
              }
              dest16._7_1_ = 0;
              uVar8 = x * a_00;
              if (depth == 4) {
                _nsmp = psStack_c0;
                for (stride = 0; stride < uVar8; stride = stride + 1) {
                  if ((stride & 1) == 0) {
                    dest16._7_1_ = *out;
                    out = out + 1;
                  }
                  *_nsmp = sVar2 * (char)((int)(uint)dest16._7_1_ >> 4);
                  dest16._7_1_ = dest16._7_1_ << 4;
                  _nsmp = _nsmp + 1;
                }
              }
              else if (depth == 2) {
                _nsmp = psStack_c0;
                for (stride = 0; stride < uVar8; stride = stride + 1) {
                  if ((stride & 3) == 0) {
                    dest16._7_1_ = *out;
                    out = out + 1;
                  }
                  *_nsmp = sVar2 * (char)((int)(uint)dest16._7_1_ >> 6);
                  dest16._7_1_ = dest16._7_1_ << 2;
                  _nsmp = _nsmp + 1;
                }
              }
              else {
                if (depth != 1) {
                  __assert_fail("depth == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                ,0x12ca,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                _nsmp = psStack_c0;
                for (stride = 0; stride < uVar8; stride = stride + 1) {
                  if ((stride & 7) == 0) {
                    dest16._7_1_ = *out;
                    out = out + 1;
                  }
                  *_nsmp = sVar2 * (char)((int)(uint)dest16._7_1_ >> 7);
                  dest16._7_1_ = dest16._7_1_ << 1;
                  _nsmp = _nsmp + 1;
                }
              }
              if (a_00 != out_n) {
                stbi__create_png_alpha_expand8(psStack_c0,psStack_c0,x,a_00);
              }
            }
            else if (depth == 8) {
              if (a_00 == out_n) {
                memcpy(psStack_c0,out,(ulong)(x * a_00));
              }
              else {
                stbi__create_png_alpha_expand8(psStack_c0,out,x,a_00);
              }
            }
            else if (depth == 0x10) {
              prior = out;
              if (a_00 == out_n) {
                for (stride = 0; stride < x * a_00; stride = stride + 1) {
                  *(ushort *)psStack_c0 = CONCAT11(*prior,prior[1]);
                  psStack_c0 = psStack_c0 + 2;
                  prior = prior + 2;
                }
              }
              else {
                if (a_00 + 1 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                ,0x12e3,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                if (a_00 == 1) {
                  for (stride = 0; stride < x; stride = stride + 1) {
                    *(ushort *)psStack_c0 = CONCAT11(*prior,prior[1]);
                    psStack_c0[2] = 0xff;
                    psStack_c0[3] = 0xff;
                    psStack_c0 = psStack_c0 + 4;
                    prior = prior + 2;
                  }
                }
                else {
                  if (a_00 != 3) {
                    __assert_fail("img_n == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                  ,0x12ea,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  for (stride = 0; stride < x; stride = stride + 1) {
                    *(ushort *)psStack_c0 = CONCAT11(*prior,prior[1]);
                    *(ushort *)(psStack_c0 + 2) = CONCAT11(prior[2],prior[3]);
                    *(ushort *)(psStack_c0 + 4) = CONCAT11(prior[4],prior[5]);
                    psStack_c0[6] = 0xff;
                    psStack_c0[7] = 0xff;
                    psStack_c0 = psStack_c0 + 8;
                    prior = prior + 6;
                  }
                }
              }
            }
          }
          free(__ptr);
          if (img_n == 0) {
            a_local._4_4_ = 0;
          }
          else {
            a_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}